

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.h
# Opt level: O0

void __thiscall jrtplib::RTPTime::RTPTime(RTPTime *this,RTPNTPTime ntptime)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t microsec;
  double x;
  uint32_t sec;
  RTPTime *this_local;
  RTPNTPTime ntptime_local;
  
  this_local = (RTPTime *)ntptime;
  uVar1 = RTPNTPTime::GetMSW((RTPNTPTime *)&this_local);
  if (uVar1 < 0x83aa7e80) {
    this->m_t = 0.0;
  }
  else {
    uVar1 = RTPNTPTime::GetMSW((RTPNTPTime *)&this_local);
    uVar2 = RTPNTPTime::GetLSW((RTPNTPTime *)&this_local);
    this->m_t = (double)((long)((double)uVar2 * 2.3283064365386963e-10 * 1000000.0) & 0xffffffff) *
                1e-06 + (double)(uVar1 + 0x7c558180);
  }
  return;
}

Assistant:

inline RTPTime::RTPTime(RTPNTPTime ntptime)
{
	if (ntptime.GetMSW() < RTP_NTPTIMEOFFSET)
	{
		m_t = 0;
	}
	else
	{
		uint32_t sec = ntptime.GetMSW() - RTP_NTPTIMEOFFSET;
		
		double x = (double)ntptime.GetLSW();
		x /= (65536.0*65536.0);
		x *= 1000000.0;
		uint32_t microsec = (uint32_t)x;

		m_t = (double)sec + 1e-6*(double)microsec;
	}
}